

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
          (accessor<pybind11::detail::accessor_policies::str_attr> *this,char (*value) [217])

{
  char *key;
  handle local_30;
  PyObject *local_28;
  handle local_20;
  char (*local_18) [217];
  char (*value_local) [217];
  accessor<pybind11::detail::accessor_policies::str_attr> *this_local;
  
  local_20.m_ptr = (this->obj).m_ptr;
  key = this->key;
  local_18 = value;
  value_local = (char (*) [217])this;
  object_or_cast<const_char_(&)[217],_0>((detail *)&local_30,value);
  local_28 = local_30.m_ptr;
  accessor_policies::str_attr::set(local_20,key,local_30);
  object::~object((object *)&local_30);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }